

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall TPZManVector<char_*,_10>::TPZManVector(TPZManVector<char_*,_10> *this,int64_t size)

{
  char **ppcVar1;
  int64_t iVar2;
  
  TPZVec<char_*>::TPZVec(&this->super_TPZVec<char_*>,0);
  (this->super_TPZVec<char_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0164fde8;
  if (size < 0xb) {
    ppcVar1 = this->fExtAlloc;
    iVar2 = 0;
  }
  else {
    ppcVar1 = (char **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    iVar2 = size;
  }
  (this->super_TPZVec<char_*>).fStore = ppcVar1;
  (this->super_TPZVec<char_*>).fNElements = size;
  (this->super_TPZVec<char_*>).fNAlloc = iVar2;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}